

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseRsaPss_Test::TestBody
          (SignatureAlgorithmTest_ParseRsaPss_Test *this)

{
  pointer *ppuVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  __0 *local_838;
  __1 *local_820;
  string local_710;
  AssertHelper local_6f0;
  Message local_6e8;
  Span<const_unsigned_char> local_6e0;
  Span<const_unsigned_char> local_6d0;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_6bc;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_;
  anon_struct_24_1_898a9ca8 *t_1;
  anon_struct_24_1_898a9ca8 *__end2_1;
  anon_struct_24_1_898a9ca8 *__begin2_1;
  anon_struct_24_1_898a9ca8 (*__range2_1) [7];
  uchar local_678 [72];
  iterator local_630;
  size_type local_628;
  allocator<unsigned_char> local_619;
  uchar local_618 [72];
  iterator local_5d0;
  size_type local_5c8;
  allocator<unsigned_char> local_5b9;
  uchar local_5b8 [72];
  iterator local_570;
  size_type local_568;
  allocator<unsigned_char> local_559;
  uchar local_558 [24];
  iterator local_540;
  size_type local_538;
  allocator<unsigned_char> local_530;
  uchar local_52f [15];
  iterator local_520;
  size_type local_518;
  allocator<unsigned_char> local_509;
  uchar local_508 [72];
  iterator local_4c0;
  size_type local_4b8;
  allocator<unsigned_char> local_4a9;
  uchar local_4a8 [72];
  iterator local_460;
  size_type local_458;
  pointer *local_450;
  undefined1 local_448 [8];
  anon_struct_24_1_898a9ca8 kInvalidTests [7];
  AssertHelper local_398;
  Message local_390;
  Span<const_unsigned_char> local_388;
  Span<const_unsigned_char> local_378;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar;
  anon_struct_32_2_5384a028 *t;
  anon_struct_32_2_5384a028 *__end2;
  anon_struct_32_2_5384a028 *__begin2;
  anon_struct_32_2_5384a028 (*__range2) [6];
  uchar local_328 [72];
  iterator local_2e0;
  size_type local_2d8;
  allocator<unsigned_char> local_2c9;
  uchar local_2c8 [72];
  iterator local_280;
  size_type local_278;
  allocator<unsigned_char> local_269;
  uchar local_268 [72];
  iterator local_220;
  size_type local_218;
  allocator<unsigned_char> local_209;
  uchar local_208 [72];
  iterator local_1c0;
  size_type local_1b8;
  allocator<unsigned_char> local_1a9;
  uchar local_1a8 [72];
  iterator local_160;
  size_type local_158;
  allocator<unsigned_char> local_139;
  uchar local_138 [72];
  iterator local_f0;
  size_type local_e8;
  SignatureAlgorithm *local_e0;
  undefined1 local_d8 [8];
  anon_struct_32_2_5384a028 kValidTests [6];
  SignatureAlgorithmTest_ParseRsaPss_Test *this_local;
  
  __range2._6_1_ = 1;
  local_138[0x30] = '\r';
  local_138[0x31] = '\x06';
  local_138[0x32] = '\t';
  local_138[0x33] = '`';
  local_138[0x34] = 0x86;
  local_138[0x35] = 'H';
  local_138[0x36] = '\x01';
  local_138[0x37] = 'e';
  local_138[0x38] = '\x03';
  local_138[0x39] = '\x04';
  local_138[0x3a] = '\x02';
  local_138[0x3b] = '\x01';
  local_138[0x3c] = '\x05';
  local_138[0x3d] = '\0';
  local_138[0x3e] = 0xa2;
  local_138[0x20] = 0xa1;
  local_138[0x21] = '\x1c';
  local_138[0x22] = '0';
  local_138[0x23] = '\x1a';
  local_138[0x24] = '\x06';
  local_138[0x25] = '\t';
  local_138[0x26] = '*';
  local_138[0x27] = 0x86;
  local_138[0x28] = 'H';
  local_138[0x29] = 0x86;
  local_138[0x2a] = 0xf7;
  local_138[0x2b] = '\r';
  local_138[0x2c] = '\x01';
  local_138[0x2d] = '\x01';
  local_138[0x2e] = '\b';
  local_138[0x2f] = '0';
  local_138[0x10] = '\x0f';
  local_138[0x11] = '0';
  local_138[0x12] = '\r';
  local_138[0x13] = '\x06';
  local_138[0x14] = '\t';
  local_138[0x15] = '`';
  local_138[0x16] = 0x86;
  local_138[0x17] = 'H';
  local_138[0x18] = '\x01';
  local_138[0x19] = 'e';
  local_138[0x1a] = '\x03';
  local_138[0x1b] = '\x04';
  local_138[0x1c] = '\x02';
  local_138[0x1d] = '\x01';
  local_138[0x1e] = '\x05';
  local_138[0x1f] = '\0';
  local_138[0] = '0';
  local_138[1] = 'A';
  local_138[2] = '\x06';
  local_138[3] = '\t';
  local_138[4] = '*';
  local_138[5] = 0x86;
  local_138[6] = 'H';
  local_138[7] = 0x86;
  local_138[8] = 0xf7;
  local_138[9] = '\r';
  local_138[10] = '\x01';
  local_138[0xb] = '\x01';
  local_138[0xc] = '\n';
  local_138[0xd] = '0';
  local_138[0xe] = '4';
  local_138[0xf] = 0xa0;
  local_138[0x3f] = '\x03';
  local_138[0x40] = '\x02';
  local_138[0x41] = '\x01';
  local_138[0x42] = ' ';
  local_f0 = local_138;
  local_e8 = 0x43;
  local_e0 = (SignatureAlgorithm *)local_d8;
  ::std::allocator<unsigned_char>::allocator(&local_139);
  __l_11._M_len = local_e8;
  __l_11._M_array = local_f0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,__l_11,&local_139);
  kValidTests[0].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  local_1a8[0x30] = '\r';
  local_1a8[0x31] = '\x06';
  local_1a8[0x32] = '\t';
  local_1a8[0x33] = '`';
  local_1a8[0x34] = 0x86;
  local_1a8[0x35] = 'H';
  local_1a8[0x36] = '\x01';
  local_1a8[0x37] = 'e';
  local_1a8[0x38] = '\x03';
  local_1a8[0x39] = '\x04';
  local_1a8[0x3a] = '\x02';
  local_1a8[0x3b] = '\x02';
  local_1a8[0x3c] = '\x05';
  local_1a8[0x3d] = '\0';
  local_1a8[0x3e] = 0xa2;
  local_1a8[0x20] = 0xa1;
  local_1a8[0x21] = '\x1c';
  local_1a8[0x22] = '0';
  local_1a8[0x23] = '\x1a';
  local_1a8[0x24] = '\x06';
  local_1a8[0x25] = '\t';
  local_1a8[0x26] = '*';
  local_1a8[0x27] = 0x86;
  local_1a8[0x28] = 'H';
  local_1a8[0x29] = 0x86;
  local_1a8[0x2a] = 0xf7;
  local_1a8[0x2b] = '\r';
  local_1a8[0x2c] = '\x01';
  local_1a8[0x2d] = '\x01';
  local_1a8[0x2e] = '\b';
  local_1a8[0x2f] = '0';
  local_1a8[0x10] = '\x0f';
  local_1a8[0x11] = '0';
  local_1a8[0x12] = '\r';
  local_1a8[0x13] = '\x06';
  local_1a8[0x14] = '\t';
  local_1a8[0x15] = '`';
  local_1a8[0x16] = 0x86;
  local_1a8[0x17] = 'H';
  local_1a8[0x18] = '\x01';
  local_1a8[0x19] = 'e';
  local_1a8[0x1a] = '\x03';
  local_1a8[0x1b] = '\x04';
  local_1a8[0x1c] = '\x02';
  local_1a8[0x1d] = '\x02';
  local_1a8[0x1e] = '\x05';
  local_1a8[0x1f] = '\0';
  local_1a8[0] = '0';
  local_1a8[1] = 'A';
  local_1a8[2] = '\x06';
  local_1a8[3] = '\t';
  local_1a8[4] = '*';
  local_1a8[5] = 0x86;
  local_1a8[6] = 'H';
  local_1a8[7] = 0x86;
  local_1a8[8] = 0xf7;
  local_1a8[9] = '\r';
  local_1a8[10] = '\x01';
  local_1a8[0xb] = '\x01';
  local_1a8[0xc] = '\n';
  local_1a8[0xd] = '0';
  local_1a8[0xe] = '4';
  local_1a8[0xf] = 0xa0;
  local_1a8[0x3f] = '\x03';
  local_1a8[0x40] = '\x02';
  local_1a8[0x41] = '\x01';
  local_1a8[0x42] = '0';
  local_160 = local_1a8;
  local_158 = 0x43;
  local_e0 = &kValidTests[0].expected;
  ::std::allocator<unsigned_char>::allocator(&local_1a9);
  __l_10._M_len = local_158;
  __l_10._M_array = local_160;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kValidTests[0].expected,
             __l_10,&local_1a9);
  kValidTests[1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 9;
  local_208[0x30] = '\r';
  local_208[0x31] = '\x06';
  local_208[0x32] = '\t';
  local_208[0x33] = '`';
  local_208[0x34] = 0x86;
  local_208[0x35] = 'H';
  local_208[0x36] = '\x01';
  local_208[0x37] = 'e';
  local_208[0x38] = '\x03';
  local_208[0x39] = '\x04';
  local_208[0x3a] = '\x02';
  local_208[0x3b] = '\x03';
  local_208[0x3c] = '\x05';
  local_208[0x3d] = '\0';
  local_208[0x3e] = 0xa2;
  local_208[0x20] = 0xa1;
  local_208[0x21] = '\x1c';
  local_208[0x22] = '0';
  local_208[0x23] = '\x1a';
  local_208[0x24] = '\x06';
  local_208[0x25] = '\t';
  local_208[0x26] = '*';
  local_208[0x27] = 0x86;
  local_208[0x28] = 'H';
  local_208[0x29] = 0x86;
  local_208[0x2a] = 0xf7;
  local_208[0x2b] = '\r';
  local_208[0x2c] = '\x01';
  local_208[0x2d] = '\x01';
  local_208[0x2e] = '\b';
  local_208[0x2f] = '0';
  local_208[0x10] = '\x0f';
  local_208[0x11] = '0';
  local_208[0x12] = '\r';
  local_208[0x13] = '\x06';
  local_208[0x14] = '\t';
  local_208[0x15] = '`';
  local_208[0x16] = 0x86;
  local_208[0x17] = 'H';
  local_208[0x18] = '\x01';
  local_208[0x19] = 'e';
  local_208[0x1a] = '\x03';
  local_208[0x1b] = '\x04';
  local_208[0x1c] = '\x02';
  local_208[0x1d] = '\x03';
  local_208[0x1e] = '\x05';
  local_208[0x1f] = '\0';
  local_208[0] = '0';
  local_208[1] = 'A';
  local_208[2] = '\x06';
  local_208[3] = '\t';
  local_208[4] = '*';
  local_208[5] = 0x86;
  local_208[6] = 'H';
  local_208[7] = 0x86;
  local_208[8] = 0xf7;
  local_208[9] = '\r';
  local_208[10] = '\x01';
  local_208[0xb] = '\x01';
  local_208[0xc] = '\n';
  local_208[0xd] = '0';
  local_208[0xe] = '4';
  local_208[0xf] = 0xa0;
  local_208[0x3f] = '\x03';
  local_208[0x40] = '\x02';
  local_208[0x41] = '\x01';
  local_208[0x42] = '@';
  local_1c0 = local_208;
  local_1b8 = 0x43;
  local_e0 = &kValidTests[1].expected;
  ::std::allocator<unsigned_char>::allocator(&local_209);
  __l_09._M_len = local_1b8;
  __l_09._M_array = local_1c0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kValidTests[1].expected,
             __l_09,&local_209);
  kValidTests[2].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 10;
  local_268[0x30] = '\t';
  local_268[0x31] = '`';
  local_268[0x32] = 0x86;
  local_268[0x33] = 'H';
  local_268[0x34] = '\x01';
  local_268[0x35] = 'e';
  local_268[0x36] = '\x03';
  local_268[0x37] = '\x04';
  local_268[0x38] = '\x02';
  local_268[0x39] = '\x01';
  local_268[0x3a] = 0xa2;
  local_268[0x3b] = '\x03';
  local_268[0x3c] = '\x02';
  local_268[0x3d] = '\x01';
  local_268[0x3e] = ' ';
  local_268[0x20] = '0';
  local_268[0x21] = '\x18';
  local_268[0x22] = '\x06';
  local_268[0x23] = '\t';
  local_268[0x24] = '*';
  local_268[0x25] = 0x86;
  local_268[0x26] = 'H';
  local_268[0x27] = 0x86;
  local_268[0x28] = 0xf7;
  local_268[0x29] = '\r';
  local_268[0x2a] = '\x01';
  local_268[0x2b] = '\x01';
  local_268[0x2c] = '\b';
  local_268[0x2d] = '0';
  local_268[0x2e] = '\v';
  local_268[0x2f] = 6;
  local_268[0x10] = '\r';
  local_268[0x11] = '0';
  local_268[0x12] = '\v';
  local_268[0x13] = '\x06';
  local_268[0x14] = '\t';
  local_268[0x15] = '`';
  local_268[0x16] = 0x86;
  local_268[0x17] = 'H';
  local_268[0x18] = '\x01';
  local_268[0x19] = 'e';
  local_268[0x1a] = '\x03';
  local_268[0x1b] = '\x04';
  local_268[0x1c] = '\x02';
  local_268[0x1d] = '\x01';
  local_268[0x1e] = 0xa1;
  local_268[0x1f] = '\x1a';
  local_268[0] = '0';
  local_268[1] = '=';
  local_268[2] = '\x06';
  local_268[3] = '\t';
  local_268[4] = '*';
  local_268[5] = 0x86;
  local_268[6] = 'H';
  local_268[7] = 0x86;
  local_268[8] = 0xf7;
  local_268[9] = '\r';
  local_268[10] = '\x01';
  local_268[0xb] = '\x01';
  local_268[0xc] = '\n';
  local_268[0xd] = '0';
  local_268[0xe] = '0';
  local_268[0xf] = 0xa0;
  local_220 = local_268;
  local_218 = 0x3f;
  local_e0 = &kValidTests[2].expected;
  ::std::allocator<unsigned_char>::allocator(&local_269);
  __l_08._M_len = local_218;
  __l_08._M_array = local_220;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kValidTests[2].expected,
             __l_08,&local_269);
  kValidTests[3].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  local_2c8[0x30] = '\t';
  local_2c8[0x31] = '`';
  local_2c8[0x32] = 0x86;
  local_2c8[0x33] = 'H';
  local_2c8[0x34] = '\x01';
  local_2c8[0x35] = 'e';
  local_2c8[0x36] = '\x03';
  local_2c8[0x37] = '\x04';
  local_2c8[0x38] = '\x02';
  local_2c8[0x39] = '\x02';
  local_2c8[0x3a] = 0xa2;
  local_2c8[0x3b] = '\x03';
  local_2c8[0x3c] = '\x02';
  local_2c8[0x3d] = '\x01';
  local_2c8[0x3e] = '0';
  local_2c8[0x20] = '0';
  local_2c8[0x21] = '\x18';
  local_2c8[0x22] = '\x06';
  local_2c8[0x23] = '\t';
  local_2c8[0x24] = '*';
  local_2c8[0x25] = 0x86;
  local_2c8[0x26] = 'H';
  local_2c8[0x27] = 0x86;
  local_2c8[0x28] = 0xf7;
  local_2c8[0x29] = '\r';
  local_2c8[0x2a] = '\x01';
  local_2c8[0x2b] = '\x01';
  local_2c8[0x2c] = '\b';
  local_2c8[0x2d] = '0';
  local_2c8[0x2e] = '\v';
  local_2c8[0x2f] = 6;
  local_2c8[0x10] = '\r';
  local_2c8[0x11] = '0';
  local_2c8[0x12] = '\v';
  local_2c8[0x13] = '\x06';
  local_2c8[0x14] = '\t';
  local_2c8[0x15] = '`';
  local_2c8[0x16] = 0x86;
  local_2c8[0x17] = 'H';
  local_2c8[0x18] = '\x01';
  local_2c8[0x19] = 'e';
  local_2c8[0x1a] = '\x03';
  local_2c8[0x1b] = '\x04';
  local_2c8[0x1c] = '\x02';
  local_2c8[0x1d] = '\x02';
  local_2c8[0x1e] = 0xa1;
  local_2c8[0x1f] = '\x1a';
  local_2c8[0] = '0';
  local_2c8[1] = '=';
  local_2c8[2] = '\x06';
  local_2c8[3] = '\t';
  local_2c8[4] = '*';
  local_2c8[5] = 0x86;
  local_2c8[6] = 'H';
  local_2c8[7] = 0x86;
  local_2c8[8] = 0xf7;
  local_2c8[9] = '\r';
  local_2c8[10] = '\x01';
  local_2c8[0xb] = '\x01';
  local_2c8[0xc] = '\n';
  local_2c8[0xd] = '0';
  local_2c8[0xe] = '0';
  local_2c8[0xf] = 0xa0;
  local_280 = local_2c8;
  local_278 = 0x3f;
  local_e0 = &kValidTests[3].expected;
  ::std::allocator<unsigned_char>::allocator(&local_2c9);
  __l_07._M_len = local_278;
  __l_07._M_array = local_280;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kValidTests[3].expected,
             __l_07,&local_2c9);
  kValidTests[4].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 9;
  local_328[0x30] = '\t';
  local_328[0x31] = '`';
  local_328[0x32] = 0x86;
  local_328[0x33] = 'H';
  local_328[0x34] = '\x01';
  local_328[0x35] = 'e';
  local_328[0x36] = '\x03';
  local_328[0x37] = '\x04';
  local_328[0x38] = '\x02';
  local_328[0x39] = '\x03';
  local_328[0x3a] = 0xa2;
  local_328[0x3b] = '\x03';
  local_328[0x3c] = '\x02';
  local_328[0x3d] = '\x01';
  local_328[0x3e] = '@';
  local_328[0x20] = '0';
  local_328[0x21] = '\x18';
  local_328[0x22] = '\x06';
  local_328[0x23] = '\t';
  local_328[0x24] = '*';
  local_328[0x25] = 0x86;
  local_328[0x26] = 'H';
  local_328[0x27] = 0x86;
  local_328[0x28] = 0xf7;
  local_328[0x29] = '\r';
  local_328[0x2a] = '\x01';
  local_328[0x2b] = '\x01';
  local_328[0x2c] = '\b';
  local_328[0x2d] = '0';
  local_328[0x2e] = '\v';
  local_328[0x2f] = 6;
  local_328[0x10] = '\r';
  local_328[0x11] = '0';
  local_328[0x12] = '\v';
  local_328[0x13] = '\x06';
  local_328[0x14] = '\t';
  local_328[0x15] = '`';
  local_328[0x16] = 0x86;
  local_328[0x17] = 'H';
  local_328[0x18] = '\x01';
  local_328[0x19] = 'e';
  local_328[0x1a] = '\x03';
  local_328[0x1b] = '\x04';
  local_328[0x1c] = '\x02';
  local_328[0x1d] = '\x03';
  local_328[0x1e] = 0xa1;
  local_328[0x1f] = '\x1a';
  local_328[0] = '0';
  local_328[1] = '=';
  local_328[2] = '\x06';
  local_328[3] = '\t';
  local_328[4] = '*';
  local_328[5] = 0x86;
  local_328[6] = 'H';
  local_328[7] = 0x86;
  local_328[8] = 0xf7;
  local_328[9] = '\r';
  local_328[10] = '\x01';
  local_328[0xb] = '\x01';
  local_328[0xc] = '\n';
  local_328[0xd] = '0';
  local_328[0xe] = '0';
  local_328[0xf] = 0xa0;
  local_2e0 = local_328;
  local_2d8 = 0x3f;
  local_e0 = &kValidTests[4].expected;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range2 + 7));
  __l_06._M_len = local_2d8;
  __l_06._M_array = local_2e0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kValidTests[4].expected,
             __l_06,(allocator<unsigned_char> *)((long)&__range2 + 7));
  kValidTests[5].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 10;
  __range2._6_1_ = 0;
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range2 + 7));
  ::std::allocator<unsigned_char>::~allocator(&local_2c9);
  ::std::allocator<unsigned_char>::~allocator(&local_269);
  ::std::allocator<unsigned_char>::~allocator(&local_209);
  ::std::allocator<unsigned_char>::~allocator(&local_1a9);
  ::std::allocator<unsigned_char>::~allocator(&local_139);
  for (__end2 = (anon_struct_32_2_5384a028 *)local_d8;
      __end2 != (anon_struct_32_2_5384a028 *)&kValidTests[5].expected; __end2 = __end2 + 1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end2;
    Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)&local_388,&__end2->data);
    bssl::der::Input::Input((Input *)&local_378,local_388);
    local_368 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
                ParseSignatureAlgorithm((Input)local_378);
    testing::internal::EqHelper::
    Compare<std::optional<bssl::SignatureAlgorithm>,_bssl::SignatureAlgorithm,_nullptr>
              ((EqHelper *)local_360,"ParseSignatureAlgorithm(der::Input(t.data))","t.expected",
               (optional<bssl::SignatureAlgorithm> *)&local_368,
               (SignatureAlgorithm *)
               ((long)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x18));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar2) {
      testing::Message::Message(&local_390);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
                 ,0x48f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_398,&local_390);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::Message::~Message(&local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  }
  __range2_1._6_1_ = 1;
  local_4a8[0x30] = '\r';
  local_4a8[0x31] = '\x06';
  local_4a8[0x32] = '\t';
  local_4a8[0x33] = '`';
  local_4a8[0x34] = 0x86;
  local_4a8[0x35] = 'H';
  local_4a8[0x36] = '\x01';
  local_4a8[0x37] = 'e';
  local_4a8[0x38] = '\x03';
  local_4a8[0x39] = '\x04';
  local_4a8[0x3a] = '\x02';
  local_4a8[0x3b] = '\x02';
  local_4a8[0x3c] = '\x05';
  local_4a8[0x3d] = '\0';
  local_4a8[0x20] = 0xa1;
  local_4a8[0x21] = '\x1c';
  local_4a8[0x22] = '0';
  local_4a8[0x23] = '\x1a';
  local_4a8[0x24] = '\x06';
  local_4a8[0x25] = '\t';
  local_4a8[0x26] = '*';
  local_4a8[0x27] = 0x86;
  local_4a8[0x28] = 'H';
  local_4a8[0x29] = 0x86;
  local_4a8[0x2a] = 0xf7;
  local_4a8[0x2b] = '\r';
  local_4a8[0x2c] = '\x01';
  local_4a8[0x2d] = '\x01';
  local_4a8[0x2e] = '\b';
  local_4a8[0x2f] = '0';
  local_4a8[0x10] = '\x0f';
  local_4a8[0x11] = '0';
  local_4a8[0x12] = '\r';
  local_4a8[0x13] = '\x06';
  local_4a8[0x14] = '\t';
  local_4a8[0x15] = '`';
  local_4a8[0x16] = 0x86;
  local_4a8[0x17] = 'H';
  local_4a8[0x18] = '\x01';
  local_4a8[0x19] = 'e';
  local_4a8[0x1a] = '\x03';
  local_4a8[0x1b] = '\x04';
  local_4a8[0x1c] = '\x02';
  local_4a8[0x1d] = '\x01';
  local_4a8[0x1e] = '\x05';
  local_4a8[0x1f] = '\0';
  local_4a8[0] = '0';
  local_4a8[1] = '<';
  local_4a8[2] = '\x06';
  local_4a8[3] = '\t';
  local_4a8[4] = '*';
  local_4a8[5] = 0x86;
  local_4a8[6] = 'H';
  local_4a8[7] = 0x86;
  local_4a8[8] = 0xf7;
  local_4a8[9] = '\r';
  local_4a8[10] = '\x01';
  local_4a8[0xb] = '\x01';
  local_4a8[0xc] = '\n';
  local_4a8[0xd] = '0';
  local_4a8[0xe] = '/';
  local_4a8[0xf] = 0xa0;
  local_460 = local_4a8;
  local_458 = 0x3e;
  local_450 = (pointer *)local_448;
  ::std::allocator<unsigned_char>::allocator(&local_4a9);
  __l_05._M_len = local_458;
  __l_05._M_array = local_460;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_448,__l_05,&local_4a9);
  ppuVar1 = &kInvalidTests[0].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_508[0x30] = '\x06';
  local_508[0x31] = '\b';
  local_508[0x32] = '*';
  local_508[0x33] = 0x86;
  local_508[0x34] = 'H';
  local_508[0x35] = 0x86;
  local_508[0x36] = 0xf7;
  local_508[0x37] = '\r';
  local_508[0x38] = '\x02';
  local_508[0x39] = '\x05';
  local_508[0x3a] = '\x05';
  local_508[0x3b] = '\0';
  local_508[0x3c] = 0xa2;
  local_508[0x3d] = '\x03';
  local_508[0x3e] = '\x02';
  local_508[0x3f] = '\x01';
  local_508[0x20] = '\x1b';
  local_508[0x21] = '0';
  local_508[0x22] = '\x19';
  local_508[0x23] = '\x06';
  local_508[0x24] = '\t';
  local_508[0x25] = '*';
  local_508[0x26] = 0x86;
  local_508[0x27] = 'H';
  local_508[0x28] = 0x86;
  local_508[0x29] = 0xf7;
  local_508[0x2a] = '\r';
  local_508[0x2b] = '\x01';
  local_508[0x2c] = '\x01';
  local_508[0x2d] = '\b';
  local_508[0x2e] = '0';
  local_508[0x2f] = '\f';
  local_508[0x10] = '\x0e';
  local_508[0x11] = '0';
  local_508[0x12] = '\f';
  local_508[0x13] = '\x06';
  local_508[0x14] = '\b';
  local_508[0x15] = '*';
  local_508[0x16] = 0x86;
  local_508[0x17] = 'H';
  local_508[0x18] = 0x86;
  local_508[0x19] = 0xf7;
  local_508[0x1a] = '\r';
  local_508[0x1b] = '\x02';
  local_508[0x1c] = '\x05';
  local_508[0x1d] = '\x05';
  local_508[0x1e] = '\0';
  local_508[0x1f] = 0xa1;
  local_508[0] = '0';
  local_508[1] = '?';
  local_508[2] = '\x06';
  local_508[3] = '\t';
  local_508[4] = '*';
  local_508[5] = 0x86;
  local_508[6] = 'H';
  local_508[7] = 0x86;
  local_508[8] = 0xf7;
  local_508[9] = '\r';
  local_508[10] = '\x01';
  local_508[0xb] = '\x01';
  local_508[0xc] = '\n';
  local_508[0xd] = '0';
  local_508[0xe] = '2';
  local_508[0xf] = 0xa0;
  local_508[0x40] = 0x10;
  local_4c0 = local_508;
  local_4b8 = 0x41;
  local_450 = ppuVar1;
  ::std::allocator<unsigned_char>::allocator(&local_509);
  __l_04._M_len = local_4b8;
  __l_04._M_array = local_4c0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_04,&local_509);
  ppuVar1 = &kInvalidTests[1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_52f[0] = '0';
  local_52f[1] = 0xd;
  local_52f[2] = 6;
  local_52f[3] = 9;
  local_52f[4] = 0x2a;
  local_52f[5] = 0x86;
  local_52f[6] = 0x48;
  local_52f[7] = 0x86;
  local_52f[8] = 0xf7;
  local_52f[9] = 0xd;
  local_52f[10] = 1;
  local_52f[0xb] = 1;
  local_52f[0xc] = 10;
  local_52f[0xd] = 0x30;
  local_52f[0xe] = 0;
  local_520 = local_52f;
  local_518 = 0xf;
  local_450 = ppuVar1;
  ::std::allocator<unsigned_char>::allocator(&local_530);
  __l_03._M_len = local_518;
  __l_03._M_array = local_520;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_03,&local_530);
  ppuVar1 = &kInvalidTests[2].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_558[0] = '0';
  local_558[1] = '\x12';
  local_558[2] = '\x06';
  local_558[3] = '\t';
  local_558[4] = '*';
  local_558[5] = 0x86;
  local_558[6] = 'H';
  local_558[7] = 0x86;
  local_558[8] = 0xf7;
  local_558[9] = '\r';
  local_558[10] = '\x01';
  local_558[0xb] = '\x01';
  local_558[0xc] = '\n';
  local_558[0xd] = '0';
  local_558[0xe] = '\x05';
  local_558[0xf] = 0xa2;
  local_558[0x10] = '\x03';
  local_558[0x11] = '\x02';
  local_558[0x12] = '\x01';
  local_558[0x13] = '\x15';
  local_540 = local_558;
  local_538 = 0x14;
  local_450 = ppuVar1;
  ::std::allocator<unsigned_char>::allocator(&local_559);
  __l_02._M_len = local_538;
  __l_02._M_array = local_540;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_02,&local_559);
  ppuVar1 = &kInvalidTests[3].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5b8[0x30] = '\r';
  local_5b8[0x31] = '\x06';
  local_5b8[0x32] = '\t';
  local_5b8[0x33] = '`';
  local_5b8[0x34] = 0x86;
  local_5b8[0x35] = 'H';
  local_5b8[0x36] = '\x01';
  local_5b8[0x37] = 'e';
  local_5b8[0x38] = '\x03';
  local_5b8[0x39] = '\x04';
  local_5b8[0x3a] = '\x02';
  local_5b8[0x3b] = '\x01';
  local_5b8[0x3c] = '\x05';
  local_5b8[0x3d] = '\0';
  local_5b8[0x3e] = 0xa2;
  local_5b8[0x20] = 0xa1;
  local_5b8[0x21] = '\x1c';
  local_5b8[0x22] = '0';
  local_5b8[0x23] = '\x1a';
  local_5b8[0x24] = '\x06';
  local_5b8[0x25] = '\t';
  local_5b8[0x26] = '*';
  local_5b8[0x27] = 0x86;
  local_5b8[0x28] = 'H';
  local_5b8[0x29] = 0x86;
  local_5b8[0x2a] = 0xf7;
  local_5b8[0x2b] = '\r';
  local_5b8[0x2c] = '\x01';
  local_5b8[0x2d] = '\x01';
  local_5b8[0x2e] = '\b';
  local_5b8[0x2f] = '0';
  local_5b8[0x10] = '\x0f';
  local_5b8[0x11] = '0';
  local_5b8[0x12] = '\r';
  local_5b8[0x13] = '\x06';
  local_5b8[0x14] = '\t';
  local_5b8[0x15] = '`';
  local_5b8[0x16] = 0x86;
  local_5b8[0x17] = 'H';
  local_5b8[0x18] = '\x01';
  local_5b8[0x19] = 'e';
  local_5b8[0x1a] = '\x03';
  local_5b8[0x1b] = '\x04';
  local_5b8[0x1c] = '\x02';
  local_5b8[0x1d] = '\x01';
  local_5b8[0x1e] = '\x05';
  local_5b8[0x1f] = '\0';
  local_5b8[0] = '0';
  local_5b8[1] = 'A';
  local_5b8[2] = '\x06';
  local_5b8[3] = '\t';
  local_5b8[4] = '*';
  local_5b8[5] = 0x86;
  local_5b8[6] = 'H';
  local_5b8[7] = 0x86;
  local_5b8[8] = 0xf7;
  local_5b8[9] = '\r';
  local_5b8[10] = '\x01';
  local_5b8[0xb] = '\x01';
  local_5b8[0xc] = '\n';
  local_5b8[0xd] = '0';
  local_5b8[0xe] = '4';
  local_5b8[0xf] = 0xa0;
  local_5b8[0x3f] = '\x03';
  local_5b8[0x40] = '\x02';
  local_5b8[0x41] = '\x01';
  local_5b8[0x42] = '!';
  local_570 = local_5b8;
  local_568 = 0x43;
  local_450 = ppuVar1;
  ::std::allocator<unsigned_char>::allocator(&local_5b9);
  __l_01._M_len = local_568;
  __l_01._M_array = local_570;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_01,&local_5b9);
  ppuVar1 = &kInvalidTests[4].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_618[0x30] = '\r';
  local_618[0x31] = '\x06';
  local_618[0x32] = '\t';
  local_618[0x33] = '`';
  local_618[0x34] = 0x86;
  local_618[0x35] = 'H';
  local_618[0x36] = '\x01';
  local_618[0x37] = 'e';
  local_618[0x38] = '\x03';
  local_618[0x39] = '\x04';
  local_618[0x3a] = '\x02';
  local_618[0x3b] = '\x02';
  local_618[0x3c] = '\x05';
  local_618[0x3d] = '\0';
  local_618[0x3e] = 0xa2;
  local_618[0x20] = 0xa1;
  local_618[0x21] = '\x1c';
  local_618[0x22] = '0';
  local_618[0x23] = '\x1a';
  local_618[0x24] = '\x06';
  local_618[0x25] = '\t';
  local_618[0x26] = '*';
  local_618[0x27] = 0x86;
  local_618[0x28] = 'H';
  local_618[0x29] = 0x86;
  local_618[0x2a] = 0xf7;
  local_618[0x2b] = '\r';
  local_618[0x2c] = '\x01';
  local_618[0x2d] = '\x01';
  local_618[0x2e] = '\b';
  local_618[0x2f] = '0';
  local_618[0x10] = '\x0f';
  local_618[0x11] = '0';
  local_618[0x12] = '\r';
  local_618[0x13] = '\x06';
  local_618[0x14] = '\t';
  local_618[0x15] = '`';
  local_618[0x16] = 0x86;
  local_618[0x17] = 'H';
  local_618[0x18] = '\x01';
  local_618[0x19] = 'e';
  local_618[0x1a] = '\x03';
  local_618[0x1b] = '\x04';
  local_618[0x1c] = '\x02';
  local_618[0x1d] = '\x02';
  local_618[0x1e] = '\x05';
  local_618[0x1f] = '\0';
  local_618[0] = '0';
  local_618[1] = 'A';
  local_618[2] = '\x06';
  local_618[3] = '\t';
  local_618[4] = '*';
  local_618[5] = 0x86;
  local_618[6] = 'H';
  local_618[7] = 0x86;
  local_618[8] = 0xf7;
  local_618[9] = '\r';
  local_618[10] = '\x01';
  local_618[0xb] = '\x01';
  local_618[0xc] = '\n';
  local_618[0xd] = '0';
  local_618[0xe] = '4';
  local_618[0xf] = 0xa0;
  local_618[0x3f] = '\x03';
  local_618[0x40] = '\x02';
  local_618[0x41] = '\x01';
  local_618[0x42] = '1';
  local_5d0 = local_618;
  local_5c8 = 0x43;
  local_450 = ppuVar1;
  ::std::allocator<unsigned_char>::allocator(&local_619);
  __l_00._M_len = local_5c8;
  __l_00._M_array = local_5d0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_00,&local_619);
  ppuVar1 = &kInvalidTests[5].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_678[0x30] = '\r';
  local_678[0x31] = '\x06';
  local_678[0x32] = '\t';
  local_678[0x33] = '`';
  local_678[0x34] = 0x86;
  local_678[0x35] = 'H';
  local_678[0x36] = '\x01';
  local_678[0x37] = 'e';
  local_678[0x38] = '\x03';
  local_678[0x39] = '\x04';
  local_678[0x3a] = '\x02';
  local_678[0x3b] = '\x03';
  local_678[0x3c] = '\x05';
  local_678[0x3d] = '\0';
  local_678[0x3e] = 0xa2;
  local_678[0x20] = 0xa1;
  local_678[0x21] = '\x1c';
  local_678[0x22] = '0';
  local_678[0x23] = '\x1a';
  local_678[0x24] = '\x06';
  local_678[0x25] = '\t';
  local_678[0x26] = '*';
  local_678[0x27] = 0x86;
  local_678[0x28] = 'H';
  local_678[0x29] = 0x86;
  local_678[0x2a] = 0xf7;
  local_678[0x2b] = '\r';
  local_678[0x2c] = '\x01';
  local_678[0x2d] = '\x01';
  local_678[0x2e] = '\b';
  local_678[0x2f] = '0';
  local_678[0x10] = '\x0f';
  local_678[0x11] = '0';
  local_678[0x12] = '\r';
  local_678[0x13] = '\x06';
  local_678[0x14] = '\t';
  local_678[0x15] = '`';
  local_678[0x16] = 0x86;
  local_678[0x17] = 'H';
  local_678[0x18] = '\x01';
  local_678[0x19] = 'e';
  local_678[0x1a] = '\x03';
  local_678[0x1b] = '\x04';
  local_678[0x1c] = '\x02';
  local_678[0x1d] = '\x03';
  local_678[0x1e] = '\x05';
  local_678[0x1f] = '\0';
  local_678[0] = '0';
  local_678[1] = 'A';
  local_678[2] = '\x06';
  local_678[3] = '\t';
  local_678[4] = '*';
  local_678[5] = 0x86;
  local_678[6] = 'H';
  local_678[7] = 0x86;
  local_678[8] = 0xf7;
  local_678[9] = '\r';
  local_678[10] = '\x01';
  local_678[0xb] = '\x01';
  local_678[0xc] = '\n';
  local_678[0xd] = '0';
  local_678[0xe] = '4';
  local_678[0xf] = 0xa0;
  local_678[0x3f] = '\x03';
  local_678[0x40] = '\x02';
  local_678[0x41] = '\x01';
  local_678[0x42] = 'A';
  local_630 = local_678;
  local_628 = 0x43;
  local_450 = ppuVar1;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range2_1 + 7));
  __l._M_len = local_628;
  __l._M_array = local_630;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l,
             (allocator<unsigned_char> *)((long)&__range2_1 + 7));
  __range2_1._6_1_ = 0;
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range2_1 + 7));
  ::std::allocator<unsigned_char>::~allocator(&local_619);
  ::std::allocator<unsigned_char>::~allocator(&local_5b9);
  ::std::allocator<unsigned_char>::~allocator(&local_559);
  ::std::allocator<unsigned_char>::~allocator(&local_530);
  ::std::allocator<unsigned_char>::~allocator(&local_509);
  ::std::allocator<unsigned_char>::~allocator(&local_4a9);
  for (__end2_1 = (anon_struct_24_1_898a9ca8 *)local_448;
      __end2_1 !=
      (anon_struct_24_1_898a9ca8 *)
      &kInvalidTests[6].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage; __end2_1 = __end2_1 + 1) {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end2_1;
    Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)&local_6e0,&__end2_1->data);
    bssl::der::Input::Input((Input *)&local_6d0,local_6e0);
    local_6bc = (_Optional_payload_base<bssl::SignatureAlgorithm>)
                ParseSignatureAlgorithm((Input)local_6d0);
    local_6b1 = ::std::optional::operator_cast_to_bool((optional *)&local_6bc);
    local_6b1 = !local_6b1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
    if (!bVar2) {
      testing::Message::Message(&local_6e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_710,(internal *)local_6b0,
                 (AssertionResult *)"ParseSignatureAlgorithm(der::Input(t.data))","true","false",
                 in_R9);
      pcVar3 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_6f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
                 ,0x54d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
      testing::internal::AssertHelper::~AssertHelper(&local_6f0);
      ::std::__cxx11::string::~string((string *)&local_710);
      testing::Message::~Message(&local_6e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  }
  local_820 = (__1 *)&kInvalidTests[6].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  do {
    local_820 = local_820 + -0x18;
    (anonymous_namespace)::SignatureAlgorithmTest_ParseRsaPss_Test::TestBody()::$_1::~__1(local_820)
    ;
  } while (local_820 != (__1 *)local_448);
  local_838 = (__0 *)&kValidTests[5].expected;
  do {
    local_838 = local_838 + -0x20;
    (anonymous_namespace)::SignatureAlgorithmTest_ParseRsaPss_Test::TestBody()::$_0::~__0(local_838)
    ;
  } while (local_838 != (__0 *)local_d8);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseRsaPss) {
  // Test data generated with https://github.com/google/der-ascii.
  struct {
    std::vector<uint8_t> data;
    SignatureAlgorithm expected;
  } kValidTests[] = {
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha256
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha256
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 32 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x20},
       SignatureAlgorithm::kRsaPssSha256},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha384
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha384
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 48 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x02, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x02,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x30},
       SignatureAlgorithm::kRsaPssSha384},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha512
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha512
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 64 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x03, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x40},
       SignatureAlgorithm::kRsaPssSha512},

      // The same inputs as above, but the NULLs in the digest algorithms are
      // omitted.
      {{0x30, 0x3d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x30, 0xa0, 0x0d, 0x30, 0x0b, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0xa1, 0x1a, 0x30,
        0x18, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x08, 0x30, 0x0b, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03,
        0x04, 0x02, 0x01, 0xa2, 0x03, 0x02, 0x01, 0x20},
       SignatureAlgorithm::kRsaPssSha256},
      {{0x30, 0x3d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x30, 0xa0, 0x0d, 0x30, 0x0b, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x02, 0xa1, 0x1a, 0x30,
        0x18, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x08, 0x30, 0x0b, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03,
        0x04, 0x02, 0x02, 0xa2, 0x03, 0x02, 0x01, 0x30},
       SignatureAlgorithm::kRsaPssSha384},
      {{0x30, 0x3d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x30, 0xa0, 0x0d, 0x30, 0x0b, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03, 0xa1, 0x1a, 0x30,
        0x18, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x08, 0x30, 0x0b, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03,
        0x04, 0x02, 0x03, 0xa2, 0x03, 0x02, 0x01, 0x40},
       SignatureAlgorithm::kRsaPssSha512}};
  for (const auto &t : kValidTests) {
    EXPECT_EQ(ParseSignatureAlgorithm(der::Input(t.data)), t.expected);
  }

  struct {
    std::vector<uint8_t> data;
  } kInvalidTests[] = {
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha256
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha384
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //           NULL {}
      //         }
      //       }
      //     }
      //   }
      // }
      {{0x30, 0x3c, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x2f, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0x05, 0x00, 0xa1,
        0x1c, 0x30, 0x1a, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d,
        0x01, 0x01, 0x08, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01,
        0x65, 0x03, 0x04, 0x02, 0x02, 0x05, 0x00}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # md5
      //         OBJECT_IDENTIFIER { 1.2.840.113549.2.5 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # md5
      //           OBJECT_IDENTIFIER { 1.2.840.113549.2.5 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 16 }
      //     }
      //   }
      // }
      {{0x30, 0x3f, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x32, 0xa0, 0x0e, 0x30, 0x0c, 0x06, 0x08, 0x2a,
        0x86, 0x48, 0x86, 0xf7, 0x0d, 0x02, 0x05, 0x05, 0x00, 0xa1, 0x1b,
        0x30, 0x19, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x08, 0x30, 0x0c, 0x06, 0x08, 0x2a, 0x86, 0x48, 0x86, 0xf7,
        0x0d, 0x02, 0x05, 0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x10}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   # SHA-1 with salt length 20 is the default.
      //   SEQUENCE {}
      // }
      {{0x30, 0x0d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x00}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [2] {
      //       INTEGER { 21 }
      //     }
      //   }
      // }
      {{0x30, 0x12, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d,
        0x01, 0x01, 0x0a, 0x30, 0x05, 0xa2, 0x03, 0x02, 0x01, 0x15}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha256
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha256
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 33 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x21}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha384
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha384
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 49 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x02, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x02,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x31}},

      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha512
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha512
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 65 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x03, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x41}},
  };
  for (const auto &t : kInvalidTests) {
    EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(t.data)));
  }
}